

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqoptimizer.cpp
# Opt level: O0

void __thiscall SQOptimizer::optimize(SQOptimizer *this)

{
  int iVar1;
  int iVar2;
  SQFuncState *pSVar3;
  size_type sVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  SQInstruction *pSVar8;
  Jump *pJVar9;
  SQInteger SVar10;
  sqvector<SQOptimizer::Jump,_unsigned_int> *in_RDI;
  SQOptimizer *in_stack_00000020;
  uint32_t constI;
  int nextJumpVal;
  SQInstruction originalJump;
  int change;
  int i_1;
  int i;
  SQInstructionVec *instr;
  int pass;
  SQFuncState *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  anon_union_4_2_91d81cc7_for_SQInstruction_0 in_stack_fffffffffffffea4;
  SQFuncState *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  uchar in_stack_fffffffffffffeb7;
  anon_union_4_2_91d81cc7_for_SQInstruction_0 local_124;
  SQOptimizer *in_stack_fffffffffffffee0;
  int in_stack_ffffffffffffff0c;
  SQFuncState *this_00;
  SQFuncState *in_stack_ffffffffffffff18;
  byte local_a9;
  SQObjectPtr local_90;
  uint local_80;
  anon_union_4_2_91d81cc7_for_SQInstruction_0 local_7c;
  anon_union_4_2_91d81cc7_for_SQInstruction_0 local_78 [2];
  int local_70;
  uint local_6c;
  size_type local_68;
  size_type local_64;
  int local_60;
  int local_5c;
  undefined1 local_58;
  undefined1 local_57;
  size_type local_54;
  size_type local_50;
  int local_4c;
  int local_48;
  undefined1 local_44;
  undefined1 local_43;
  size_type local_40;
  size_type local_3c;
  int local_38;
  int local_34;
  undefined1 local_30;
  undefined1 local_2f;
  uint local_2c;
  SQFuncState *local_28;
  undefined1 local_20 [20];
  int local_c;
  
  *(undefined1 *)&in_RDI[1]._alloc_ctx = 1;
  local_c = 0;
  do {
    local_a9 = 0;
    if (local_c < 2) {
      local_a9 = *(byte *)&in_RDI[1]._alloc_ctx;
    }
    if ((local_a9 & 1) == 0) {
      optimizeJumpFolding(in_stack_fffffffffffffee0);
      return;
    }
    memset(local_20,0,0x14);
    sqvector<SQOptimizer::Jump,_unsigned_int>::resize
              ((sqvector<SQOptimizer::Jump,_unsigned_int> *)
               CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               (size_type)((ulong)in_stack_fffffffffffffea8 >> 0x20),
               (Jump *)CONCAT44(in_stack_fffffffffffffea4._arg1,in_stack_fffffffffffffea0));
    local_28 = (SQFuncState *)(in_RDI[1]._vals + 10);
    for (local_2c = 0; uVar7 = local_2c,
        sVar4 = sqvector<SQInstruction,_unsigned_int>::size
                          ((sqvector<SQInstruction,_unsigned_int> *)local_28), uVar7 < sVar4;
        local_2c = local_2c + 1) {
      pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                         ((sqvector<SQInstruction,_unsigned_int> *)local_28,local_2c);
      uVar7 = local_2c;
      uVar5 = (uint)pSVar8->op;
      if (uVar5 - 0x22 < 2) {
LAB_001cdff3:
        local_40 = local_2c;
        local_3c = local_2c;
        pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                           ((sqvector<SQInstruction,_unsigned_int> *)local_28,local_2c);
        uVar5 = local_2c;
        local_38 = uVar7 + (pSVar8->field_0)._arg1 + 1;
        pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                           ((sqvector<SQInstruction,_unsigned_int> *)local_28,local_2c);
        local_34 = uVar5 + (pSVar8->field_0)._arg1 + 1;
        local_30 = 0;
        local_2f = 0;
        sqvector<SQOptimizer::Jump,_unsigned_int>::push_back
                  ((sqvector<SQOptimizer::Jump,_unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffea4._arg1,in_stack_fffffffffffffea0),
                   (Jump *)in_stack_fffffffffffffe98);
      }
      else if (uVar5 - 0x24 < 2) {
        local_54 = local_2c;
        local_50 = local_2c;
        pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                           ((sqvector<SQInstruction,_unsigned_int> *)local_28,local_2c);
        iVar6 = SQInstruction::_sarg0(pSVar8);
        uVar5 = local_2c;
        local_4c = uVar7 + iVar6 + 1;
        pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                           ((sqvector<SQInstruction,_unsigned_int> *)local_28,local_2c);
        iVar6 = SQInstruction::_sarg0(pSVar8);
        local_48 = uVar5 + iVar6 + 1;
        local_44 = 0;
        local_43 = 1;
        sqvector<SQOptimizer::Jump,_unsigned_int>::push_back
                  ((sqvector<SQOptimizer::Jump,_unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffea4._arg1,in_stack_fffffffffffffea0),
                   (Jump *)in_stack_fffffffffffffe98);
      }
      else {
        if ((((uVar5 - 0x26 < 2) || (uVar5 - 0x35 < 2)) || (uVar5 - 0x3d < 3)) || (uVar5 == 0x42))
        goto LAB_001cdff3;
        if (uVar5 == 0x48) {
          local_68 = local_2c;
          local_64 = local_2c;
          pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                             ((sqvector<SQInstruction,_unsigned_int> *)local_28,local_2c);
          uVar5 = local_2c;
          local_60 = uVar7 + (pSVar8->field_0)._arg1;
          pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                             ((sqvector<SQInstruction,_unsigned_int> *)local_28,local_2c);
          local_5c = uVar5 + (pSVar8->field_0)._arg1;
          local_58 = 0;
          local_57 = 0;
          sqvector<SQOptimizer::Jump,_unsigned_int>::push_back
                    ((sqvector<SQOptimizer::Jump,_unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffea4._arg1,in_stack_fffffffffffffea0),
                     (Jump *)in_stack_fffffffffffffe98);
        }
      }
    }
    *(undefined1 *)&in_RDI[1]._alloc_ctx = 0;
    optimizeConstFolding(in_stack_00000020);
    optimizeEmptyJumps((SQOptimizer *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0))
    ;
    if (((ulong)in_RDI[1]._alloc_ctx & 1) != 0) {
      for (local_6c = 0; uVar7 = local_6c,
          sVar4 = sqvector<SQOptimizer::Jump,_unsigned_int>::size(in_RDI), uVar7 < sVar4;
          local_6c = local_6c + 1) {
        pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
        if ((pJVar9->modified & 1U) != 0) {
          pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
          iVar6 = pJVar9->jumpTo;
          pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
          iVar1 = pJVar9->originalJumpTo;
          pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
          iVar2 = pJVar9->instructionIndex;
          pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
          local_70 = (iVar6 - iVar1) - (iVar2 - pJVar9->originalInstructionIndex);
          pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
          iVar6 = local_70;
          if (pJVar9->jumpArg == JUMP_ARG1) {
            in_stack_ffffffffffffff18 = local_28;
            pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
            pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                               ((sqvector<SQInstruction,_unsigned_int> *)in_stack_ffffffffffffff18,
                                pJVar9->instructionIndex);
            (pSVar8->field_0)._arg1 = iVar6 + (pSVar8->field_0)._arg1;
          }
          else {
            this_00 = local_28;
            pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
            pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                               ((sqvector<SQInstruction,_unsigned_int> *)this_00,
                                pJVar9->instructionIndex);
            local_78 = pSVar8->field_0;
            iVar6 = SQInstruction::_sarg0((SQInstruction *)local_78);
            pSVar3 = local_28;
            local_7c._arg1 = iVar6 + local_70;
            if ((local_7c._arg1 < -0x80) || (0x7f < local_7c._arg1)) {
              pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
              pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                                 ((sqvector<SQInstruction,_unsigned_int> *)pSVar3,
                                  pJVar9->instructionIndex);
              pSVar3 = local_28;
              if (pSVar8->op != '%') {
                pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
                pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                                   ((sqvector<SQInstruction,_unsigned_int> *)pSVar3,
                                    pJVar9->instructionIndex);
                if (pSVar8->op != '$') goto LAB_001ce699;
              }
              pSVar3 = local_28;
              in_stack_fffffffffffffee0 = (SQOptimizer *)in_RDI[1]._vals;
              pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
              pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                                 ((sqvector<SQInstruction,_unsigned_int> *)pSVar3,
                                  pJVar9->instructionIndex);
              if (pSVar8->op == '%') {
                local_124._arg1 = local_78[0]._arg1;
              }
              else {
                local_124._farg1 = (float)(long)local_78[0]._arg1;
              }
              ::SQObjectPtr::SQObjectPtr(&local_90,local_124._farg1);
              SVar10 = SQFuncState::GetConstant
                                 (in_stack_ffffffffffffff18,(SQObject *)this_00,
                                  in_stack_ffffffffffffff0c);
              uVar7 = (uint)SVar10;
              ::SQObjectPtr::~SQObjectPtr
                        ((SQObjectPtr *)
                         CONCAT44(in_stack_fffffffffffffea4._arg1,in_stack_fffffffffffffea0));
              local_80 = uVar7;
              if (uVar7 < 0x100) {
                pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
                pJVar9->jumpArg = JUMP_ARG1;
                in_stack_fffffffffffffe98 = local_28;
                in_stack_fffffffffffffea4 = local_7c;
                pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
                pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                                   ((sqvector<SQInstruction,_unsigned_int> *)
                                    in_stack_fffffffffffffe98,pJVar9->instructionIndex);
                pSVar8->field_0 = in_stack_fffffffffffffea4;
                in_stack_fffffffffffffeb7 = (uchar)local_80;
                in_stack_fffffffffffffea8 = local_28;
                pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
                pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                                   ((sqvector<SQInstruction,_unsigned_int> *)
                                    in_stack_fffffffffffffea8,pJVar9->instructionIndex);
                pSVar3 = local_28;
                pSVar8->_arg0 = in_stack_fffffffffffffeb7;
                pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
                pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                                   ((sqvector<SQInstruction,_unsigned_int> *)pSVar3,
                                    pJVar9->instructionIndex);
                pSVar8->op = '&';
              }
            }
            else {
              in_stack_ffffffffffffff0c =
                   CONCAT13((char)local_7c._arg1,(int3)in_stack_ffffffffffffff0c);
              pJVar9 = sqvector<SQOptimizer::Jump,_unsigned_int>::operator[](in_RDI,local_6c);
              pSVar8 = sqvector<SQInstruction,_unsigned_int>::operator[]
                                 ((sqvector<SQInstruction,_unsigned_int> *)pSVar3,
                                  pJVar9->instructionIndex);
              pSVar8->_arg0 = (uchar)((uint)in_stack_ffffffffffffff0c >> 0x18);
            }
          }
        }
LAB_001ce699:
      }
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void SQOptimizer::optimize()
{
    codeChanged = true;
    for (int pass = 0; pass < 2 && codeChanged; pass++) {
        jumps.resize(0);
        SQInstructionVec & instr = fs->_instructions;
        for (int i = 0; i < instr.size(); i++)
            switch (instr[i].op) {
                case _OP_JMP:
                case _OP_JCMP:
                case _OP_JCMPK:
                case _OP_JZ:
                case _OP_AND:
                case _OP_OR:
                case _OP_PUSHTRAP:
                case _OP_FOREACH:
                case _OP_PREFOREACH:
                case _OP_POSTFOREACH:
                    jumps.push_back({i, i, i + instr[i]._arg1 + 1, i + instr[i]._arg1 + 1, false, JumpArg::JUMP_ARG1});
                    break;
                case _OP_JCMPI:
                case _OP_JCMPF:
                    jumps.push_back({i, i, i + instr[i]._sarg0() + 1, i + instr[i]._sarg0() + 1, false, JumpArg::JUMP_ARG0});
                    break;
                case _OP_NULLCOALESCE:
                    jumps.push_back({i, i, i + instr[i]._arg1, i + instr[i]._arg1, false, JumpArg::JUMP_ARG1});
                    break;
                default:
                    break;
            }

        codeChanged = false;
        optimizeConstFolding();
        optimizeEmptyJumps();

        if (codeChanged)
            for (int i = 0; i < jumps.size(); i++)
                if (jumps[i].modified) {
                    const int change = (jumps[i].jumpTo - jumps[i].originalJumpTo) - (jumps[i].instructionIndex - jumps[i].originalInstructionIndex);
                    if (jumps[i].jumpArg == JumpArg::JUMP_ARG1)
                        instr[jumps[i].instructionIndex]._arg1 += change;
                    else {
                        const SQInstruction originalJump = instr[jumps[i].instructionIndex];
                        const int nextJumpVal = originalJump._sarg0() + change;
                        if (nextJumpVal >= -128 && nextJumpVal <= 127)
                        {
                            instr[jumps[i].instructionIndex]._arg0 = nextJumpVal; // still fit
                        } else if (instr[jumps[i].instructionIndex].op == _OP_JCMPF || instr[jumps[i].instructionIndex].op == _OP_JCMPI) {
                            const uint32_t constI = fs->GetConstant(SQObjectPtr(instr[jumps[i].instructionIndex].op == _OP_JCMPF ? originalJump._farg1 : (SQInteger)originalJump._arg1), 255);
                            if (constI <= 255u) // we still fit in const table
                            {
                              jumps[i].jumpArg = JumpArg::JUMP_ARG1;
                              instr[jumps[i].instructionIndex]._arg1 = nextJumpVal;
                              instr[jumps[i].instructionIndex]._arg0 = constI;
                              instr[jumps[i].instructionIndex].op = _OP_JCMPK;
                            } else
                              assert(0);//todo: we need to convert back to OP_JCMP, and we need to generate load instruction for that
                        } else
                          assert(0);//todo: we need to convert back to OP_JCMP, and we need to generate load instruction for that
                    }
                }
    }

    optimizeJumpFolding();

#ifdef _DEBUG_DUMP
    for (int i = 0; i < jumps.size(); i++)
        printf(_SC("JUMPS:  instruction: %d  to: %d\n"), jumps[i].instructionIndex, jumps[i].jumpTo);
#endif

}